

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O1

Cdr * __thiscall
eprosima::fastcdr::Cdr::serializeArray(Cdr *this,int32_t *long_t,size_t numElements)

{
  char **ppcVar1;
  ulong minSizeInc;
  char *pcVar2;
  bool bVar3;
  NotEnoughMemoryException *this_00;
  char *pcVar4;
  size_t __n;
  ulong uVar5;
  undefined8 local_20;
  
  local_20 = long_t;
  pcVar4 = (this->m_currentPosition).m_currentPosition;
  uVar5 = 0;
  if (this->m_lastDataSize < 4) {
    uVar5 = (ulong)(*(int *)&(this->m_alignPosition).m_currentPosition - (int)pcVar4 & 3);
  }
  minSizeInc = uVar5 + numElements * 4;
  if (((ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar4) < minSizeInc) &&
     (bVar3 = resize(this,minSizeInc), !bVar3)) {
    this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
    exception::NotEnoughMemoryException::NotEnoughMemoryException
              (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
    __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                exception::NotEnoughMemoryException::~NotEnoughMemoryException);
  }
  this->m_lastDataSize = 4;
  if (numElements != 0) {
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + uVar5;
  }
  __n = numElements * 4;
  if (this->m_swapBytes == true) {
    if (0 < (long)__n) {
      pcVar4 = (char *)&local_20;
      do {
        pcVar2 = (this->m_currentPosition).m_currentPosition;
        (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
        *pcVar2 = pcVar4[3];
        pcVar2 = (this->m_currentPosition).m_currentPosition;
        (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
        *pcVar2 = pcVar4[2];
        pcVar2 = (this->m_currentPosition).m_currentPosition;
        (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
        *pcVar2 = pcVar4[1];
        pcVar2 = (this->m_currentPosition).m_currentPosition;
        (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
        *pcVar2 = *pcVar4;
        pcVar4 = pcVar4 + 4;
      } while (pcVar4 < (char *)((long)&local_20 + __n));
    }
  }
  else {
    memcpy((this->m_currentPosition).m_currentPosition,local_20,__n);
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + __n;
  }
  return this;
}

Assistant:

Cdr& Cdr::serializeArray(const int32_t *long_t, size_t numElements)
{
    size_t align = alignment(sizeof(*long_t));
    size_t totalSize = sizeof(*long_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if(((m_lastPosition - m_currentPosition) >= sizeAligned) || resize(sizeAligned))
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*long_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            const char *dst = reinterpret_cast<const char*>(&long_t);
            const char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*long_t))
            {
                m_currentPosition++ << dst[3];
                m_currentPosition++ << dst[2];
                m_currentPosition++ << dst[1];
                m_currentPosition++ << dst[0];
            }
        }
        else
        {
            m_currentPosition.memcopy(long_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}